

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  InternalRunDeathTestFlag *pIVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  size_type *psVar10;
  __sighandler_t p_Var11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ulong *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  undefined8 uVar17;
  long lVar18;
  size_t __len;
  int pipe_fd [2];
  unique_ptr<char_*[],_std::default_delete<char_*[]>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  string filter_flag;
  sigaction ignore_sigprof_action;
  sigaction saved_sigprof_action;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  string local_218;
  int local_1f8;
  int local_1f4;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [32];
  int local_1c8 [2];
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  value_type local_1a0;
  value_type local_180;
  _union_1457 local_160;
  undefined1 local_158 [8];
  ulong local_150;
  ulong uStack_148;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1c8[0] = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
                 death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar5 = pipe(&local_1f8);
  if (iVar5 == -1) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2b8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
      local_2b8.field_2._M_allocated_capacity = *psVar10;
      local_2b8.field_2._8_8_ = plVar7[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2b8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
      local_2f8.field_2._M_allocated_capacity = *psVar10;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x550;
    StreamableToString<int>(&local_278,(int *)&local_258);
    std::operator+(&local_2d8,&local_2f8,&local_278);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_160.sa_handler = (__sighandler_t)*plVar7;
    p_Var11 = (__sighandler_t)(plVar7 + 2);
    if (local_160.sa_handler == p_Var11) {
      local_150 = *(ulong *)p_Var11;
      uStack_148 = plVar7[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var11;
    }
    local_158 = (undefined1  [8])plVar7[1];
    *plVar7 = (long)p_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_c8.sa_handler = (__sighandler_t)*plVar7;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler == paVar15) {
      local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
      local_b8[0]._8_8_ = plVar7[3];
      local_c8.sa_handler = (__sighandler_t)local_b8;
    }
    else {
      local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
    }
    local_c0 = plVar7[1];
    *plVar7 = (long)paVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort((string *)&local_c8);
  }
  iVar5 = fcntl(local_1f4,2,0);
  if (iVar5 == -1) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2b8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
      local_2b8.field_2._M_allocated_capacity = *psVar10;
      local_2b8.field_2._8_8_ = plVar7[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2b8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
      local_2f8.field_2._M_allocated_capacity = *psVar10;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_258._M_dataplus._M_p._0_4_ = 0x553;
    StreamableToString<int>(&local_278,(int *)&local_258);
    std::operator+(&local_2d8,&local_2f8,&local_278);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_160.sa_handler = (__sighandler_t)*plVar7;
    p_Var11 = (__sighandler_t)(plVar7 + 2);
    if (local_160.sa_handler == p_Var11) {
      local_150 = *(ulong *)p_Var11;
      uStack_148 = plVar7[3];
      local_160.sa_handler = (__sighandler_t)&local_150;
    }
    else {
      local_150 = *(ulong *)p_Var11;
    }
    local_158 = (undefined1  [8])plVar7[1];
    *plVar7 = (long)p_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
    local_c8.sa_handler = (__sighandler_t)*plVar7;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler == paVar15) {
      local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
      local_b8[0]._8_8_ = plVar7[3];
      local_c8.sa_handler = (__sighandler_t)local_b8;
    }
    else {
      local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
    }
    local_c0 = plVar7[1];
    *plVar7 = (long)paVar15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort((string *)&local_c8);
  }
  paVar15 = &local_2b8.field_2;
  local_2b8._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2f8.field_2._M_allocated_capacity = *psVar10;
    local_2f8.field_2._8_8_ = plVar7[3];
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar10;
    local_2f8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2f8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8.field_2._8_8_ = plVar7[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if ((__sighandler_t)*plVar7 == p_Var11) {
    local_150 = *(ulong *)p_Var11;
    uStack_148 = plVar7[3];
  }
  else {
    local_150 = *(ulong *)p_Var11;
    local_160.sa_handler = (__sighandler_t)*plVar7;
  }
  local_158 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar12) {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_b8[0]._8_8_ = plVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar12->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*plVar7;
  }
  local_c0 = plVar7[1];
  *plVar7 = (long)paVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_180.field_2._M_allocated_capacity = *psVar10;
    local_180.field_2._8_8_ = plVar7[3];
  }
  else {
    local_180.field_2._M_allocated_capacity = *psVar10;
    local_180._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_180._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar15) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
  paVar12 = &local_258.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258.field_2._8_8_ = plVar7[3];
    local_258._M_dataplus._M_p = (pointer)paVar12;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar10;
    local_258._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_258._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
  paVar2 = &local_278.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_278.field_2._M_allocated_capacity = *psVar10;
    local_278.field_2._8_8_ = plVar7[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar10;
    local_278._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_278._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_298.field_2._M_allocated_capacity = *psVar10;
    local_298.field_2._8_8_ = plVar7[3];
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar10;
    local_298._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_298._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
  puVar13 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_2b8.field_2._M_allocated_capacity = *puVar13;
    local_2b8.field_2._8_8_ = plVar7[3];
    local_2b8._M_dataplus._M_p = (pointer)paVar15;
  }
  else {
    local_2b8.field_2._M_allocated_capacity = *puVar13;
    local_2b8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2b8._M_string_length = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_218,&this->line_);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar15) {
    uVar17 = local_2b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_218._M_string_length + local_2b8._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_) !=
        &local_218.field_2) {
      uVar17 = local_218.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_218._M_string_length + local_2b8._M_string_length) goto LAB_0010c686;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_218,0,(char *)0x0,(ulong)local_2b8._M_dataplus._M_p);
  }
  else {
LAB_0010c686:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_2b8,
                        CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_))
    ;
  }
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_2f8.field_2._M_allocated_capacity = *psVar10;
    local_2f8.field_2._8_8_ = puVar8[3];
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar10;
    local_2f8._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_2f8._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  puVar13 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_2d8.field_2._M_allocated_capacity = *puVar13;
    local_2d8.field_2._8_8_ = plVar7[3];
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *puVar13;
    local_2d8._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_2d8._M_string_length = plVar7[1];
  *plVar7 = (long)puVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>((string *)(local_1f0 + 8),local_1c8);
  uVar1 = (long)&((_Alloc_hider *)local_1e8._8_8_)->_M_p + local_2d8._M_string_length;
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    uVar17 = local_2d8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar17 < uVar1) {
    uVar16 = 0xf;
    if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
      uVar16 = local_1e8._16_8_;
    }
    if (uVar16 < uVar1) goto LAB_0010c7aa;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)(local_1f0 + 8),0,(char *)0x0,(ulong)local_2d8._M_dataplus._M_p);
  }
  else {
LAB_0010c7aa:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2d8,local_1e8._0_8_);
  }
  local_160.sa_handler = (__sighandler_t)&local_150;
  p_Var11 = (__sighandler_t)(puVar8 + 2);
  if ((__sighandler_t)*puVar8 == p_Var11) {
    local_150 = *(ulong *)p_Var11;
    uStack_148 = puVar8[3];
  }
  else {
    local_150 = *(ulong *)p_Var11;
    local_160.sa_handler = (__sighandler_t)*puVar8;
  }
  local_158 = (undefined1  [8])puVar8[1];
  *puVar8 = p_Var11;
  puVar8[1] = 0;
  *p_Var11 = (__sighandler_t)0x0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar14) {
    local_b8[0]._0_8_ = paVar14->_M_allocated_capacity;
    local_b8[0]._8_8_ = plVar7[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar14->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*plVar7;
  }
  local_c0 = plVar7[1];
  *plVar7 = (long)paVar14;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>((string *)local_1c0,&local_1f4);
  uVar1 = CONCAT44(local_1c0._12_4_,local_1c0._8_4_) + local_c0;
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar17 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar17 < uVar1) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != &local_1b0) {
      uVar17 = local_1b0._M_allocated_capacity;
    }
    if ((ulong)uVar17 < uVar1) goto LAB_0010c8f1;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_0010c8f1:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c8,local_1c0._0_8_);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  psVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1a0.field_2._M_allocated_capacity = *psVar10;
    local_1a0.field_2._8_8_ = puVar8[3];
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar10;
    local_1a0._M_dataplus._M_p = (pointer)*puVar8;
  }
  local_1a0._M_string_length = puVar8[1];
  *puVar8 = psVar10;
  puVar8[1] = 0;
  *(undefined1 *)psVar10 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != &local_1b0) {
    operator_delete((void *)local_1c0._0_8_,local_1b0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  if (local_160.sa_handler != (__sighandler_t)&local_150) {
    operator_delete(local_160.sa_handler,local_150 + 1);
  }
  if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_) !=
      &local_218.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_218._M_dataplus._M_p._4_4_,local_218._M_dataplus._M_p._0_4_),
                    local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar15) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar12) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  GetInjectableArgvs_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f0 + 8),&local_180);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1f0 + 8),&local_1a0);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler,local_b8[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  CreateArgvFromArgs((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f0);
  local_1c0._0_8_ = local_1f0;
  local_1c0._8_4_ = local_1f8;
  memset(&local_160,0,0x98);
  sigemptyset((sigset_t *)local_158);
  local_160 = (_union_1457)0x1;
  while (iVar5 = sigaction(0x1b,(sigaction *)&local_160,(sigaction *)&local_c8),
        cVar4 = FLAGS_gtest_death_test_use_fork, iVar5 == -1) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
      local_258._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_258._M_dataplus._M_p == psVar10) {
        local_258.field_2._M_allocated_capacity = *psVar10;
        local_258.field_2._8_8_ = plVar7[3];
        local_258._M_dataplus._M_p = (pointer)paVar12;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar10;
      }
      local_258._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_278._M_dataplus._M_p == psVar10) {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278.field_2._8_8_ = plVar7[3];
        local_278._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar10;
      }
      local_278._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_1c8[1] = 0x50e;
      StreamableToString<int>(&local_218,local_1c8 + 1);
      std::operator+(&local_298,&local_278,&local_218);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
      local_2b8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
        local_2b8.field_2._M_allocated_capacity = *psVar10;
        local_2b8.field_2._8_8_ = plVar7[3];
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      }
      else {
        local_2b8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2b8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
        local_2f8.field_2._M_allocated_capacity = *psVar10;
        local_2f8.field_2._8_8_ = plVar7[3];
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
        local_2d8.field_2._M_allocated_capacity = *psVar10;
        local_2d8.field_2._8_8_ = plVar7[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2d8);
    }
  }
  iVar5 = -1;
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
      AssumeRole();
    }
    iVar5 = getpagesize();
    __len = (size_t)(iVar5 * 2);
    __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
    if (__addr == (void *)0xffffffffffffffff) {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_278._M_dataplus._M_p == psVar10) {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278.field_2._8_8_ = plVar7[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar10;
      }
      local_278._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
        local_298.field_2._M_allocated_capacity = *psVar10;
        local_298.field_2._8_8_ = plVar7[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar10;
      }
      local_298._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_218._M_dataplus._M_p._0_4_ = 0x51a;
      StreamableToString<int>(&local_238,(int *)&local_218);
      std::operator+(&local_2b8,&local_298,&local_238);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
        local_2f8.field_2._M_allocated_capacity = *psVar10;
        local_2f8.field_2._8_8_ = plVar7[3];
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
        local_2d8.field_2._M_allocated_capacity = *psVar10;
        local_2d8.field_2._8_8_ = plVar7[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2d8);
    }
    lVar18 = 0;
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
      lVar18 = __len - 0x40;
    }
    if (((uint)(iVar5 * 2) < 0x41) || (((ulong)(lVar18 + (long)__addr) & 0x3f) != 0)) {
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","")
      ;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
      local_278._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_278._M_dataplus._M_p == psVar10) {
        local_278.field_2._M_allocated_capacity = *psVar10;
        local_278.field_2._8_8_ = plVar7[3];
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      }
      else {
        local_278.field_2._M_allocated_capacity = *psVar10;
      }
      local_278._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_298._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
        local_298.field_2._M_allocated_capacity = *psVar10;
        local_298.field_2._8_8_ = plVar7[3];
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar10;
      }
      local_298._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_218._M_dataplus._M_p._0_4_ = 0x528;
      StreamableToString<int>(&local_238,(int *)&local_218);
      std::operator+(&local_2b8,&local_298,&local_238);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2f8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
        local_2f8.field_2._M_allocated_capacity = *psVar10;
        local_2f8.field_2._8_8_ = plVar7[3];
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      }
      else {
        local_2f8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2f8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_2d8._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
        local_2d8.field_2._M_allocated_capacity = *psVar10;
        local_2d8.field_2._8_8_ = plVar7[3];
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      }
      else {
        local_2d8.field_2._M_allocated_capacity = *psVar10;
      }
      local_2d8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      DeathTestAbort(&local_2d8);
    }
    iVar5 = clone(ExecDeathTestChildMain,(void *)(lVar18 + (long)__addr),0x11,local_1c0);
    iVar6 = munmap(__addr,__len);
    if (iVar6 == -1) goto LAB_0010d3fd;
  }
  if ((cVar4 == '\0') || (iVar5 = fork(), iVar5 != 0)) {
    do {
      iVar6 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
      if (iVar6 != -1) {
        if (iVar5 == -1) {
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_258,"CHECK failed: File ","");
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
          local_278._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_278._M_dataplus._M_p == psVar10) {
            local_278.field_2._M_allocated_capacity = *psVar10;
            local_278.field_2._8_8_ = plVar7[3];
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          }
          else {
            local_278.field_2._M_allocated_capacity = *psVar10;
          }
          local_278._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
          local_298._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
            local_298.field_2._M_allocated_capacity = *psVar10;
            local_298.field_2._8_8_ = plVar7[3];
            local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          }
          else {
            local_298.field_2._M_allocated_capacity = *psVar10;
          }
          local_298._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          local_218._M_dataplus._M_p._0_4_ = 0x53b;
          StreamableToString<int>(&local_238,(int *)&local_218);
          std::operator+(&local_2b8,&local_298,&local_238);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
          local_2f8._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
            local_2f8.field_2._M_allocated_capacity = *psVar10;
            local_2f8.field_2._8_8_ = plVar7[3];
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
          }
          else {
            local_2f8.field_2._M_allocated_capacity = *psVar10;
          }
          local_2f8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
          local_2d8._M_dataplus._M_p = (pointer)*plVar7;
          psVar10 = (size_type *)(plVar7 + 2);
          if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
            local_2d8.field_2._M_allocated_capacity = *psVar10;
            local_2d8.field_2._8_8_ = plVar7[3];
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
          }
          else {
            local_2d8.field_2._M_allocated_capacity = *psVar10;
          }
          local_2d8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          DeathTestAbort(&local_2d8);
        }
        do {
          iVar6 = close(local_1f4);
          if (iVar6 != -1) {
            *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar5;
            (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f8;
            (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
            if (local_1f0 != (undefined1  [8])0x0) {
              operator_delete__((void *)local_1f0);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_1f0 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1
                             );
            }
            return OVERSEE_TEST;
          }
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_278,"CHECK failed: File ","");
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
        local_298._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
          local_298.field_2._M_allocated_capacity = *psVar10;
          local_298.field_2._8_8_ = plVar7[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *psVar10;
        }
        local_298._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_2b8._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
          local_2b8.field_2._M_allocated_capacity = *psVar10;
          local_2b8.field_2._8_8_ = plVar7[3];
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar10;
        }
        local_2b8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_238._M_dataplus._M_p._0_4_ = 0x56a;
        StreamableToString<int>(&local_258,(int *)&local_238);
        std::operator+(&local_2f8,&local_2b8,&local_258);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_2d8._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
          local_2d8.field_2._M_allocated_capacity = *psVar10;
          local_2d8.field_2._8_8_ = plVar7[3];
          local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        }
        else {
          local_2d8.field_2._M_allocated_capacity = *psVar10;
        }
        local_2d8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d8);
        local_160.sa_handler = (__sighandler_t)*plVar7;
        p_Var11 = (__sighandler_t)(plVar7 + 2);
        if (local_160.sa_handler == p_Var11) {
          local_150 = *(ulong *)p_Var11;
          uStack_148 = plVar7[3];
          local_160.sa_handler = (__sighandler_t)&local_150;
        }
        else {
          local_150 = *(ulong *)p_Var11;
        }
        local_158 = (undefined1  [8])plVar7[1];
        *plVar7 = (long)p_Var11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_160);
        local_c8.sa_handler = (__sighandler_t)*plVar7;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.sa_handler == paVar15) {
          local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_b8[0]._8_8_ = plVar7[3];
          local_c8.sa_handler = (__sighandler_t)local_b8;
        }
        else {
          local_b8[0]._0_8_ = paVar15->_M_allocated_capacity;
        }
        local_c0 = plVar7[1];
        *plVar7 = (long)paVar15;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        DeathTestAbort((string *)&local_c8);
      }
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"CHECK failed: File ","");
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_258._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_258._M_dataplus._M_p == psVar10) {
      local_258.field_2._M_allocated_capacity = *psVar10;
      local_258.field_2._8_8_ = plVar7[3];
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
    }
    else {
      local_258.field_2._M_allocated_capacity = *psVar10;
    }
    local_258._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
    local_278._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_278._M_dataplus._M_p == psVar10) {
      local_278.field_2._M_allocated_capacity = *psVar10;
      local_278.field_2._8_8_ = plVar7[3];
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    }
    else {
      local_278.field_2._M_allocated_capacity = *psVar10;
    }
    local_278._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_1c8[1] = 0x538;
    StreamableToString<int>(&local_218,local_1c8 + 1);
    std::operator+(&local_298,&local_278,&local_218);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2b8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2b8._M_dataplus._M_p == psVar10) {
      local_2b8.field_2._M_allocated_capacity = *psVar10;
      local_2b8.field_2._8_8_ = plVar7[3];
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    }
    else {
      local_2b8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2b8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2f8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
      local_2f8.field_2._M_allocated_capacity = *psVar10;
      local_2f8.field_2._8_8_ = plVar7[3];
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    }
    else {
      local_2f8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2f8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_2d8._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
      local_2d8.field_2._M_allocated_capacity = *psVar10;
      local_2d8.field_2._8_8_ = plVar7[3];
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar10;
    }
    local_2d8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    DeathTestAbort(&local_2d8);
  }
  ExecDeathTestChildMain(local_1c0);
LAB_0010d3fd:
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"CHECK failed: File ","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_258);
  local_278._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_278._M_dataplus._M_p == psVar10) {
    local_278.field_2._M_allocated_capacity = *psVar10;
    local_278.field_2._8_8_ = plVar7[3];
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar10;
  }
  local_278._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_298._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_298._M_dataplus._M_p == psVar10) {
    local_298.field_2._M_allocated_capacity = *psVar10;
    local_298.field_2._8_8_ = plVar7[3];
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar10;
  }
  local_298._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_218._M_dataplus._M_p._0_4_ = 0x52c;
  StreamableToString<int>(&local_238,(int *)&local_218);
  std::operator+(&local_2b8,&local_298,&local_238);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  local_2f8._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_2f8._M_dataplus._M_p == psVar10) {
    local_2f8.field_2._M_allocated_capacity = *psVar10;
    local_2f8.field_2._8_8_ = plVar7[3];
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  }
  else {
    local_2f8.field_2._M_allocated_capacity = *psVar10;
  }
  local_2f8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f8);
  local_2d8._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_2d8._M_dataplus._M_p == psVar10) {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
    local_2d8.field_2._8_8_ = plVar7[3];
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  }
  else {
    local_2d8.field_2._M_allocated_capacity = *psVar10;
  }
  local_2d8._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  DeathTestAbort(&local_2d8);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}